

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::setCapacity
          (Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this,size_t newSize)

{
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar1;
  unsigned_long *puVar2;
  RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *pRVar3;
  ulong uVar4;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar5;
  __off_t in_RDX;
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_38;
  
  uVar4 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 4) * -0x5555555555555555;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x30,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pTVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pTVar5 = (this->builder).ptr; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
    ((local_38.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.ptr =
         (pTVar5->impl).super_TupleElement<0U,_kj::String>.value.content.ptr;
    ((local_38.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.size_ =
         (pTVar5->impl).super_TupleElement<0U,_kj::String>.value.content.size_;
    (pTVar5->impl).super_TupleElement<0U,_kj::String>.value.content.ptr = (char *)0x0;
    (pTVar5->impl).super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
    puVar2 = (pTVar5->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr;
    ((local_38.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.disposer =
         (pTVar5->impl).super_TupleElement<0U,_kj::String>.value.content.disposer;
    ((local_38.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr = puVar2;
    ((local_38.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_ =
         (pTVar5->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_;
    ((local_38.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.disposer =
         (pTVar5->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.disposer;
    local_38.pos = local_38.pos + 1;
    (pTVar5->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr =
         (unsigned_long *)0x0;
    (pTVar5->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_ = 0;
  }
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::operator=
            (&this->builder,&local_38);
  pTVar1 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pTVar5 = local_38.ptr;
  if (local_38.ptr != (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0) {
    local_38.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    local_38.pos = (RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)0x0;
    local_38.endPtr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pTVar5,0x30,
               ((long)pRVar3 - (long)pTVar5 >> 4) * -0x5555555555555555,
               ((long)pTVar1 - (long)pTVar5 >> 4) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::
               destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }